

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O1

void dequantize_row_q6_K(block_q6_K *x,float *y,int64_t k)

{
  float fVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  long lVar5;
  long lVar6;
  int l;
  ulong uVar7;
  block_q6_K *pbVar8;
  uint8_t *puVar9;
  int8_t *piVar10;
  int iVar11;
  ulong uVar12;
  bool bVar13;
  
  lVar5 = k + 0xff;
  if (-1 < k) {
    lVar5 = k;
  }
  if (0xff < k) {
    lVar6 = 0;
    do {
      pbVar8 = x + lVar6;
      puVar9 = x[lVar6].qh;
      fVar1 = ggml_table_f32_f16[x[lVar6].d];
      piVar10 = x[lVar6].scales;
      iVar11 = 0;
      do {
        uVar7 = 0;
        do {
          uVar12 = uVar7 >> 4 & 0xfffffff;
          bVar2 = pbVar8->ql[uVar7];
          bVar3 = pbVar8->ql[uVar7 + 0x20];
          bVar4 = puVar9[uVar7];
          y[uVar7] = (float)(int)(char)(((bVar4 & 3) << 4 | bVar2 & 0xf) - 0x20) *
                     (float)(int)piVar10[uVar12] * fVar1;
          y[uVar7 + 0x20] =
               (float)(int)(char)((bVar4 * '\x04' & 0x30 | bVar3 & 0xf) - 0x20) *
               (float)(int)piVar10[uVar12 + 2] * fVar1;
          y[uVar7 + 0x40] =
               (float)(int)(char)((bVar4 & 0x30 | bVar2 >> 4) - 0x20) *
               (float)(int)piVar10[uVar12 + 4] * fVar1;
          y[uVar7 + 0x60] =
               (float)(int)(char)((bVar4 >> 2 & 0x30 | bVar3 >> 4) - 0x20) *
               (float)(int)piVar10[uVar12 + 6] * fVar1;
          uVar7 = uVar7 + 1;
        } while (uVar7 != 0x20);
        y = y + 0x80;
        pbVar8 = (block_q6_K *)(pbVar8->ql + 0x40);
        puVar9 = puVar9 + 0x20;
        piVar10 = piVar10 + 8;
        bVar13 = iVar11 == 0;
        iVar11 = iVar11 + 0x80;
      } while (bVar13);
      lVar6 = lVar6 + 1;
    } while (lVar6 != lVar5 >> 8);
  }
  return;
}

Assistant:

void dequantize_row_q6_K(const block_q6_K * GGML_RESTRICT x, float * GGML_RESTRICT y, int64_t k) {
    assert(k % QK_K == 0);
    const int64_t nb = k / QK_K;

    for (int i = 0; i < nb; i++) {
        const float d = GGML_FP16_TO_FP32(x[i].d);

        const uint8_t * GGML_RESTRICT ql = x[i].ql;
        const uint8_t * GGML_RESTRICT qh = x[i].qh;
        const int8_t  * GGML_RESTRICT sc = x[i].scales;

        for (int n = 0; n < QK_K; n += 128) {
            for (int l = 0; l < 32; ++l) {
                int is = l/16;
                const int8_t q1 = (int8_t)((ql[l +  0] & 0xF) | (((qh[l] >> 0) & 3) << 4)) - 32;
                const int8_t q2 = (int8_t)((ql[l + 32] & 0xF) | (((qh[l] >> 2) & 3) << 4)) - 32;
                const int8_t q3 = (int8_t)((ql[l +  0]  >> 4) | (((qh[l] >> 4) & 3) << 4)) - 32;
                const int8_t q4 = (int8_t)((ql[l + 32]  >> 4) | (((qh[l] >> 6) & 3) << 4)) - 32;
                y[l +  0] = d * sc[is + 0] * q1;
                y[l + 32] = d * sc[is + 2] * q2;
                y[l + 64] = d * sc[is + 4] * q3;
                y[l + 96] = d * sc[is + 6] * q4;
            }
            y  += 128;
            ql += 64;
            qh += 32;
            sc += 8;
        }
    }
}